

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O2

void __thiscall Catch::Section::~Section(Section *this)

{
  IResultCapture *pIVar1;
  
  if (this->m_sectionIncluded == true) {
    pIVar1 = getResultCapture();
    Timer::getElapsedSeconds(&this->m_timer);
    (*pIVar1->_vptr_IResultCapture[4])(pIVar1,this,&this->m_assertions);
  }
  std::__cxx11::string::~string((string *)&this->m_name);
  SectionInfo::~SectionInfo(&this->m_info);
  return;
}

Assistant:

Section::~Section() {
        if( m_sectionIncluded )
            getResultCapture().sectionEnded( m_info, m_assertions, m_timer.getElapsedSeconds() );
    }